

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_listener_shutdown(nni_listener *l)

{
  nni_sock *pnVar1;
  _Bool _Var2;
  nni_pipe *local_20;
  nni_pipe *p;
  nni_sock *s;
  nni_listener *l_local;
  
  pnVar1 = l->l_sock;
  _Var2 = nni_atomic_flag_test_and_set(&l->l_closing);
  if (!_Var2) {
    nni_listener_stop(l);
    nni_mtx_lock(&pnVar1->s_mx);
    for (local_20 = (nni_pipe *)nni_list_first(&l->l_pipes); local_20 != (nni_pipe *)0x0;
        local_20 = (nni_pipe *)nni_list_next(&l->l_pipes,local_20)) {
      nni_pipe_close(local_20);
    }
    nni_mtx_unlock(&pnVar1->s_mx);
  }
  return;
}

Assistant:

void
nni_listener_shutdown(nni_listener *l)
{
	nni_sock *s = l->l_sock;
	nni_pipe *p;

	if (nni_atomic_flag_test_and_set(&l->l_closing)) {
		return;
	}

	nni_listener_stop(l);

	nni_mtx_lock(&s->s_mx);
	NNI_LIST_FOREACH (&l->l_pipes, p) {
		nni_pipe_close(p);
	}
	nni_mtx_unlock(&s->s_mx);
}